

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test::testBody
          (TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test *this)

{
  size_t *this_00;
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  undefined1 local_1c8 [40];
  MockExpectedParameterDidntHappenFailure failure;
  MockExpectedCallsList matchingCalls;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test *local_10;
  TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_20);
  SimpleString::SimpleString(local_40,"bar");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar2),local_40,2);
  SimpleString::SimpleString(&local_50,"boo");
  MockExpectedCall::withParameter(pMVar3,&local_50,"str");
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString(&local_60,"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])(pMVar1,&local_60);
  SimpleString::~SimpleString(&local_60);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_70);
  SimpleString::SimpleString(&local_80,"bar");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_00,iVar2),&local_80,10);
  SimpleString::SimpleString(&local_90,"boo");
  MockExpectedCall::withParameter(pMVar3,&local_90,"bleh");
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(&local_a0,"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])(pMVar1,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(&local_b0,"boo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])(pMVar1,&local_b0);
  SimpleString::~SimpleString(&local_b0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString(&local_c0,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_c0);
  SimpleString::SimpleString(&local_d0,"bar");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_01,iVar2),&local_d0,2);
  SimpleString::SimpleString(&local_e0,"boo");
  pMVar3 = MockExpectedCall::withParameter(pMVar3,&local_e0,"blah");
  SimpleString::SimpleString(&local_f0,"baa");
  MockExpectedCall::withParameter(pMVar3,&local_f0,0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString(&local_100,"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])(pMVar1,&local_100);
  SimpleString::~SimpleString(&local_100);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call4;
  SimpleString::SimpleString(&local_110,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_110);
  SimpleString::SimpleString(&local_120,"bar");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)CONCAT44(extraout_var_02,iVar2),&local_120,0x14);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call5;
  SimpleString::SimpleString((SimpleString *)&matchingCalls.head_,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&matchingCalls.head_);
  SimpleString::~SimpleString((SimpleString *)&matchingCalls.head_);
  TEST_GROUP_CppUTestGroupMockFailureTest::addFiveCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  this_00 = &failure.super_MockFailure.super_TestFailure.message_.bufferSize_;
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)this_00);
  MockExpectedCallsList::addExpectedCall
            ((MockExpectedCallsList *)this_00,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1);
  MockExpectedCallsList::addExpectedCall
            ((MockExpectedCallsList *)
             &failure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)(local_1c8 + 0x10),"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)(local_1c8 + 0x20),pUVar4,
             (SimpleString *)(local_1c8 + 0x10),
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list,
             (MockExpectedCallsList *)
             &failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)(local_1c8 + 0x10));
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_1c8);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_1c8);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,
             "Mock Failure: Expected parameter for function \"foo\" did not happen.\n\tEXPECTED calls with MISSING parameters related to function: foo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n\t\t\tMISSING parameters: const char* boo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n\t\t\tMISSING parameters: const char* boo, unsigned int baa\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n\t\tfoo -> int bar: <20 (0x14)> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\tfoo -> int bar: <10 (0xa)>, const char* boo: <bleh> (expected 1 call, called 1 time)"
             ,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0x113,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_1c8);
  MockExpectedParameterDidntHappenFailure::~MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)(local_1c8 + 0x20));
  MockExpectedCallsList::~MockExpectedCallsList
            ((MockExpectedCallsList *)
             &failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  return;
}

Assistant:

TEST(MockFailureTest, MockExpectedParameterDidntHappenFailure)
{
    call1->withName("foo").withParameter("bar", 2).withParameter("boo", "str");
    call1->inputParameterWasPassed("bar");
    call2->withName("foo").withParameter("bar", 10).withParameter("boo", "bleh");
    call2->callWasMade(1);
    call2->inputParameterWasPassed("bar");
    call2->inputParameterWasPassed("boo");
    call3->withName("foo").withParameter("bar", 2).withParameter("boo", "blah").withParameter("baa", 0u);
    call3->inputParameterWasPassed("bar");
    call4->withName("foo").withParameter("bar", 20);
    call5->withName("unrelated");
    addFiveCallsToList();

    MockExpectedCallsList matchingCalls;
    matchingCalls.addExpectedCall(call1);
    matchingCalls.addExpectedCall(call3);

    MockExpectedParameterDidntHappenFailure failure(UtestShell::getCurrent(), "foo", *list, matchingCalls);
    STRCMP_EQUAL("Mock Failure: Expected parameter for function \"foo\" did not happen.\n"
                 "\tEXPECTED calls with MISSING parameters related to function: foo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n"
                 "\t\t\tMISSING parameters: const char* boo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n"
                 "\t\t\tMISSING parameters: const char* boo, unsigned int baa\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> int bar: <20 (0x14)> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\tfoo -> int bar: <10 (0xa)>, const char* boo: <bleh> (expected 1 call, called 1 time)",
                 failure.getMessage().asCharString());
}